

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UBool __thiscall icu_63::UnicodeString::operator==(UnicodeString *this,UnicodeString *text)

{
  UBool UVar1;
  int32_t len_00;
  int32_t iVar2;
  undefined1 local_31;
  int32_t textLength;
  int32_t len;
  UnicodeString *text_local;
  UnicodeString *this_local;
  
  UVar1 = isBogus(this);
  if (UVar1 == '\0') {
    len_00 = length(this);
    iVar2 = length(text);
    UVar1 = isBogus(text);
    local_31 = false;
    if ((UVar1 == '\0') && (local_31 = false, len_00 == iVar2)) {
      UVar1 = doEquals(this,text,len_00);
      local_31 = UVar1 != '\0';
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = isBogus(text);
  }
  return this_local._7_1_;
}

Assistant:

inline UBool
UnicodeString::operator== (const UnicodeString& text) const
{
  if(isBogus()) {
    return text.isBogus();
  } else {
    int32_t len = length(), textLength = text.length();
    return !text.isBogus() && len == textLength && doEquals(text, len);
  }
}